

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O0

void __thiscall test_adjacency_graph_degree_Test::TestBody(test_adjacency_graph_degree_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  exception *gtest_exception;
  ReturnSentinel local_120;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  pointer local_f8;
  DeathTest *gtest_dt;
  Message local_e8;
  int local_dc;
  size_t local_d8;
  size_t local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  Message local_b0;
  int local_a4;
  size_t local_a0;
  size_t local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78;
  int local_70 [4];
  size_t local_60;
  size_t local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  Adjacency_Graph<true> graph;
  test_adjacency_graph_degree_Test *this_local;
  
  Disa::create_graph_hybrid();
  local_60 = 0;
  local_58 = Disa::Adjacency_Graph<false>::degree
                       ((Adjacency_Graph<false> *)&gtest_ar.message_,&local_60);
  local_70[0] = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_50,"graph.degree(0)","2",&local_58,local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_a0 = 3;
  local_98 = Disa::Adjacency_Graph<false>::degree
                       ((Adjacency_Graph<false> *)&gtest_ar.message_,&local_a0);
  local_a4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_90,"graph.degree(3)","3",&local_98,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_d8 = 4;
  local_d0 = Disa::Adjacency_Graph<false>::degree
                       ((Adjacency_Graph<false> *)&gtest_ar.message_,&local_d8);
  local_dc = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_c8,"graph.degree(4)","5",&local_d0,&local_dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
               ,0x22d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr,(internal *)"./*",regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("1 == graph.degree(50)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
                       ,0x22e,&local_f8);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if (local_f8 == (pointer)0x0) goto LAB_0012f5e4;
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_f8);
      iVar2 = (*local_f8->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_f8->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_f8->_vptr_DeathTest[4])(local_f8,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0012f501;
        local_154 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_120,local_f8);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            gtest_exception = (exception *)0x32;
            Disa::Adjacency_Graph<false>::degree
                      ((Adjacency_Graph<false> *)&gtest_ar.message_,(size_t *)&gtest_exception);
          }
          (*local_f8->_vptr_DeathTest[5])(local_f8,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_120);
        }
LAB_0012f501:
        local_154 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_154 == 0) goto LAB_0012f5e4;
    }
  }
  testing::Message::Message(&local_160);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_168,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_graph.cpp"
             ,0x22e,pcVar4);
  testing::internal::AssertHelper::operator=(&local_168,&local_160);
  testing::internal::AssertHelper::~AssertHelper(&local_168);
  testing::Message::~Message(&local_160);
LAB_0012f5e4:
  Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(test_adjacency_graph, degree) {

  Adjacency_Graph<false> graph = create_graph_hybrid();

  EXPECT_EQ(graph.degree(0), 2);
  EXPECT_EQ(graph.degree(3), 3);
  EXPECT_EQ(graph.degree(4), 5);
  EXPECT_DEATH(1 == graph.degree(50), "./*");
}